

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Opcode;
  uint Rs;
  uint Rt2;
  uint Rn;
  uint Rt;
  uint uVar4;
  DecodeStatus local_4;
  
  RegNo = fieldFromInstruction(in_ESI,0,5);
  fieldFromInstruction(in_ESI,5,5);
  uVar1 = fieldFromInstruction(in_ESI,10,5);
  uVar2 = fieldFromInstruction(in_ESI,0x10,5);
  uVar3 = MCInst_getOpcode(in_RDI);
  uVar4 = uVar3;
  if (uVar3 - 0x3a5 < 3) goto LAB_002c289f;
  if (uVar3 == 0x3a8) goto LAB_002c28d4;
  if (uVar3 == 0x3a9) {
LAB_002c2909:
    DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
    DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
    goto LAB_002c2983;
  }
  if (uVar3 == 0x3aa) {
LAB_002c2953:
    DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
    DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
    goto LAB_002c2983;
  }
  if (uVar3 - 0x3ab < 3) goto LAB_002c289f;
  if (uVar3 == 0x3ae) goto LAB_002c28d4;
  if (uVar3 == 0x429) goto LAB_002c2909;
  if (uVar3 == 0x42a) goto LAB_002c2953;
  if (uVar3 - 0x42b < 3) {
LAB_002c289f:
    DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
  }
  else {
    if (uVar3 != 0x42e) {
      if (uVar3 - 0x739 < 3) goto LAB_002c289f;
      if (uVar3 != 0x73c) {
        if (uVar3 == 0x73d) {
LAB_002c28f1:
          DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar3))
          ;
          goto LAB_002c2909;
        }
        if (uVar3 == 0x73e) {
LAB_002c293b:
          DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar3))
          ;
          goto LAB_002c2953;
        }
        if (uVar3 - 0x73f < 3) {
LAB_002c2887:
          DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar3))
          ;
          goto LAB_002c289f;
        }
        if (uVar3 != 0x742) {
          if (uVar3 == 0x791) goto LAB_002c28f1;
          if (uVar3 == 0x792) goto LAB_002c293b;
          if (uVar3 - 0x793 < 3) goto LAB_002c2887;
          if (uVar3 != 0x796) {
            return MCDisassembler_Fail;
          }
        }
        DecodeGPR32RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar3,uVar3));
      }
    }
LAB_002c28d4:
    DecodeGPR64RegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
  }
LAB_002c2983:
  DecodeGPR64spRegisterClass(in_RCX,RegNo,CONCAT44(uVar1,uVar2),(void *)CONCAT44(uVar4,uVar3));
  if (((((uVar4 == 0x3a9) || (uVar4 == 0x429)) || (uVar4 == 0x3aa)) || (uVar4 == 0x42a)) &&
     (RegNo == uVar1)) {
    local_4 = MCDisassembler_SoftFail;
  }
  else {
    local_4 = MCDisassembler_Success;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	unsigned Rs = fieldFromInstruction(insn, 16, 5);
	unsigned Opcode = MCInst_getOpcode(Inst);

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_STLXRW:
		case AArch64_STLXRB:
		case AArch64_STLXRH:
		case AArch64_STXRW:
		case AArch64_STXRB:
		case AArch64_STXRH:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARW:
		case AArch64_LDARB:
		case AArch64_LDARH:
		case AArch64_LDAXRW:
		case AArch64_LDAXRB:
		case AArch64_LDAXRH:
		case AArch64_LDXRW:
		case AArch64_LDXRB:
		case AArch64_LDXRH:
		case AArch64_STLRW:
		case AArch64_STLRB:
		case AArch64_STLRH:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXRX:
		case AArch64_STXRX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARX:
		case AArch64_LDAXRX:
		case AArch64_LDXRX:
		case AArch64_STLRX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXPW:
		case AArch64_STXPW:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPW:
		case AArch64_LDXPW:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_STLXPX:
		case AArch64_STXPX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPX:
		case AArch64_LDXPX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);

	// You shouldn't load to the same register twice in an instruction...
	if ((Opcode == AArch64_LDAXPW || Opcode == AArch64_LDXPW ||
				Opcode == AArch64_LDAXPX || Opcode == AArch64_LDXPX) &&
			Rt == Rt2)
		return SoftFail;

	return Success;
}